

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::Framebuffer::Framebuffer
          (Framebuffer *this,Context *context,FboConfig *config,int width,int height,deUint32 fbo,
          deUint32 colorBufferName,deUint32 depthStencilBufferName)

{
  GLenum GVar1;
  int iVar2;
  GLenum GVar3;
  GLenum GVar4;
  deUint32 dVar5;
  int iVar6;
  Error *this_00;
  TestError *this_01;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  string local_60;
  code *local_40;
  int local_38;
  
  dVar5 = config->buffers;
  GVar1 = config->colorType;
  GVar3 = config->colorFormat;
  GVar4 = config->depthStencilType;
  iVar6 = config->width;
  iVar9 = config->height;
  iVar2 = config->samples;
  (this->m_config).depthStencilFormat = config->depthStencilFormat;
  (this->m_config).width = iVar6;
  (this->m_config).height = iVar9;
  (this->m_config).samples = iVar2;
  (this->m_config).buffers = dVar5;
  (this->m_config).colorType = GVar1;
  (this->m_config).colorFormat = GVar3;
  (this->m_config).depthStencilType = GVar4;
  this->m_context = context;
  this->m_framebuffer = fbo;
  this->m_colorBuffer = 0;
  this->m_depthStencilBuffer = 0;
  checkColorFormatSupport(context,config->colorFormat);
  uVar8 = this->m_framebuffer;
  if (uVar8 == 0) {
    (*context->_vptr_Context[10])(context,1,&this->m_framebuffer);
    uVar8 = this->m_framebuffer;
  }
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)uVar8);
  if (((this->m_config).buffers & 0x4000) != 0) {
    GVar1 = (this->m_config).colorType;
    if (GVar1 == 0x8d41) {
      dVar5 = createRbo(this,colorBufferName,(this->m_config).colorFormat,width,height);
      this->m_colorBuffer = dVar5;
      (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,(ulong)dVar5);
    }
    else {
      if (GVar1 != 0xde1) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Unsupported type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
                   ,0x116);
        goto LAB_0069344f;
      }
      dVar5 = createTex2D(this,colorBufferName,(this->m_config).colorFormat,width,height);
      this->m_colorBuffer = dVar5;
      (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,(ulong)dVar5,0);
    }
  }
  if (((this->m_config).buffers & 0x500) != 0) {
    GVar1 = (this->m_config).depthStencilType;
    if (GVar1 == 0x8d41) {
      dVar5 = createRbo(this,depthStencilBufferName,(this->m_config).depthStencilFormat,width,height
                       );
    }
    else {
      if (GVar1 != 0xde1) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Unsupported type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
                   ,0x121);
LAB_0069344f:
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      dVar5 = createTex2D(this,depthStencilBufferName,(this->m_config).depthStencilFormat,width,
                          height);
    }
    this->m_depthStencilBuffer = dVar5;
  }
  iVar6 = 2;
  while( true ) {
    iVar9 = iVar6 + -1;
    if (iVar6 == 0) break;
    bVar10 = iVar6 != 2;
    uVar8 = 0x400;
    if (!bVar10) {
      uVar8 = 0x100;
    }
    iVar6 = iVar9;
    if (((this->m_config).buffers & uVar8) != 0) {
      uVar7 = (ulong)((uint)bVar10 << 5 | 0x8d00);
      GVar1 = (this->m_config).depthStencilType;
      if (GVar1 == 0x8d41) {
        (*context->_vptr_Context[0x20])
                  (context,0x8d40,uVar7,0x8d41,(ulong)this->m_depthStencilBuffer);
      }
      else if (GVar1 == 0xde1) {
        (*context->_vptr_Context[0x1e])
                  (context,0x8d40,uVar7,0xde1,(ulong)this->m_depthStencilBuffer,0);
      }
    }
  }
  iVar6 = (*this->m_context->_vptr_Context[0x79])();
  if (iVar6 == 0) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x38);
  local_40 = glu::getErrorName;
  local_38 = iVar6;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_40);
  glu::Error::Error(this_00,iVar6,local_60._M_dataplus._M_p,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
                    ,0x138);
  __cxa_throw(this_00,&glu::Error::typeinfo,glu::Error::~Error);
}

Assistant:

Framebuffer::Framebuffer (sglr::Context& context, const FboConfig& config, int width, int height, deUint32 fbo, deUint32 colorBufferName, deUint32 depthStencilBufferName)
	: m_config				(config)
	, m_context				(context)
	, m_framebuffer			(fbo)
	, m_colorBuffer			(0)
	, m_depthStencilBuffer	(0)
{
	// Verify that color format is supported
	checkColorFormatSupport(context, config.colorFormat);

	if (m_framebuffer == 0)
		context.genFramebuffers(1, &m_framebuffer);
	context.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	if (m_config.buffers & (GL_COLOR_BUFFER_BIT))
	{
		switch (m_config.colorType)
		{
			case GL_TEXTURE_2D:
				m_colorBuffer = createTex2D(colorBufferName, m_config.colorFormat, width, height);
				context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_colorBuffer, 0);
				break;

			case GL_RENDERBUFFER:
				m_colorBuffer = createRbo(colorBufferName, m_config.colorFormat, width, height);
				context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorBuffer);
				break;

			default:
				TCU_FAIL("Unsupported type");
		}
	}

	if (m_config.buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))
	{
		switch (m_config.depthStencilType)
		{
			case GL_TEXTURE_2D:		m_depthStencilBuffer = createTex2D(depthStencilBufferName, m_config.depthStencilFormat, width, height);		break;
			case GL_RENDERBUFFER:	m_depthStencilBuffer = createRbo(depthStencilBufferName, m_config.depthStencilFormat, width, height);		break;
			default:
				TCU_FAIL("Unsupported type");
		}
	}

	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32	bit		= ndx ? GL_STENCIL_BUFFER_BIT : GL_DEPTH_BUFFER_BIT;
		deUint32	point	= ndx ? GL_STENCIL_ATTACHMENT : GL_DEPTH_ATTACHMENT;

		if ((m_config.buffers & bit) == 0)
			continue; /* Not used. */

		switch (m_config.depthStencilType)
		{
			case GL_TEXTURE_2D:		context.framebufferTexture2D(GL_FRAMEBUFFER, point, GL_TEXTURE_2D, m_depthStencilBuffer, 0);	break;
			case GL_RENDERBUFFER:	context.framebufferRenderbuffer(GL_FRAMEBUFFER, point, GL_RENDERBUFFER, m_depthStencilBuffer);	break;
			default:
				DE_ASSERT(false);
		}
	}

	GLenum err = m_context.getError();
	if (err != GL_NO_ERROR)
		throw glu::Error(err, glu::getErrorStr(err).toString().c_str(), "", __FILE__, __LINE__);

	context.bindFramebuffer(GL_FRAMEBUFFER, 0);
}